

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O1

int Test_N_VConstrMask(N_Vector C,N_Vector X,N_Vector M,sunindextype param_4,int myid)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  sunrealtype sVar12;
  double dVar13;
  double dVar14;
  timespec spec;
  timespec local_40;
  
  if (param_4 < 7) {
    printf("Error Test_N_VConstrMask: Local vector length is %ld, length must be >= 7\n",param_4);
    iVar8 = 1;
  }
  else {
    uVar10 = 0;
    do {
      set_element(M,uVar10,-1.0);
      sVar12 = (sunrealtype)(&DAT_00114f28)[uVar10 % 7];
      set_element(C,uVar10,(sunrealtype)(&DAT_00114ef0)[uVar10 % 7]);
      set_element(X,uVar10,sVar12);
      uVar10 = uVar10 + 1;
    } while (param_4 != uVar10);
    iVar8 = 1;
    clock_gettime(1,&local_40);
    lVar5 = local_40.tv_sec - base_time_tv_sec;
    dVar13 = (double)local_40.tv_nsec;
    iVar3 = N_VConstrMask(C,X,M);
    sync_device(X);
    clock_gettime(1,&local_40);
    lVar6 = local_40.tv_sec - base_time_tv_sec;
    dVar14 = (double)local_40.tv_nsec;
    iVar4 = check_ans(0.0,M,param_4);
    if ((iVar4 == 0) && (iVar3 != 0)) {
      iVar8 = 0;
      if (myid == 0) {
        puts("PASSED test -- N_VConstrMask Case 1 ");
      }
    }
    else {
      printf(">>> FAILED test -- N_VConstrMask Case 1, Proc %d \n",(ulong)(uint)myid);
    }
    max_time(X,(dVar14 / 1000000000.0 + (double)lVar6) - (dVar13 / 1000000000.0 + (double)lVar5));
    if (print_time != 0) {
      printf("%s Time: %22.15e\n\n","N_VConstrMask");
    }
    uVar10 = 1;
    if (1 < param_4) {
      uVar10 = param_4;
    }
    uVar9 = 0;
    do {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar9;
      uVar7 = SUB168(auVar1 * ZEXT816(0xcccccccccccccccd),8) * 2 & 0xfffffffffffffff8;
      set_element(M,uVar9,-1.0);
      sVar12 = *(sunrealtype *)((long)&DAT_00114f88 + uVar9 * 8 + uVar7 * -5);
      set_element(C,uVar9,*(sunrealtype *)((long)&DAT_00114f60 + uVar9 * 8 + uVar7 * -5));
      set_element(X,uVar9,sVar12);
      uVar9 = uVar9 + 1;
    } while (uVar10 != uVar9);
    clock_gettime(1,&local_40);
    lVar5 = local_40.tv_sec - base_time_tv_sec;
    dVar13 = (double)local_40.tv_nsec;
    iVar3 = N_VConstrMask(C,X,M);
    sync_device(X);
    clock_gettime(1,&local_40);
    lVar6 = local_40.tv_sec - base_time_tv_sec;
    uVar10 = 1;
    if (1 < param_4) {
      uVar10 = param_4;
    }
    uVar9 = 0;
    bVar2 = false;
    do {
      sVar12 = get_element(M,uVar9);
      if ((uVar9 / 5) * 5 + 2 == uVar9) {
        bVar11 = sVar12 == 0.0;
      }
      else {
        bVar11 = sVar12 == 1.0;
      }
      if ((!bVar11) || (NAN(sVar12))) {
        bVar2 = true;
      }
      uVar9 = uVar9 + 1;
    } while (uVar10 != uVar9);
    if (bVar2 || iVar3 != 0) {
      printf(">>> FAILED test -- N_VConstrMask Case 2, Proc %d \n",(ulong)(uint)myid);
      iVar8 = iVar8 + 1;
    }
    else if (myid == 0) {
      puts("PASSED test -- N_VConstrMask Case 2 ");
    }
    max_time(X,((double)local_40.tv_nsec / 1000000000.0 + (double)lVar6) -
               (dVar13 / 1000000000.0 + (double)lVar5));
    if (print_time != 0) {
      printf("%s Time: %22.15e\n\n","N_VConstrMask");
    }
  }
  return iVar8;
}

Assistant:

int Test_N_VConstrMask(N_Vector C, N_Vector X, N_Vector M,
                       sunindextype local_length, int myid)
{
  int fails = 0, failure = 0;
  double start_time, stop_time, maxt;
  sunindextype i;
  sunbooleantype test;

  if (local_length < 7)
  {
    printf("Error Test_N_VConstrMask: Local vector length is %ld, length must "
           "be >= 7\n",
           (long int)local_length);
    return (1);
  }

  /*
   * Case 1: Return True
   */

  /* fill vector data */
  for (i = 0; i < local_length; i++)
  {
    set_element(M, i, NEG_ONE);

    switch (i % 7)
    {
    case 0:
      /* c = -2, test for < 0*/
      set_element(C, i, NEG_TWO);
      set_element(X, i, NEG_TWO);
      break;

    case 1:
      /* c = -1, test for <= 0 */
      set_element(C, i, NEG_ONE);
      set_element(X, i, NEG_ONE);
      break;

    case 2:
      /* c = -1, test for == 0 */
      set_element(C, i, NEG_ONE);
      set_element(X, i, ZERO);
      break;

    case 3:
      /* c = 0, no test */
      set_element(C, i, ZERO);
      set_element(X, i, HALF);
      break;

    case 4:
      /* c = 1, test for == 0*/
      set_element(C, i, ONE);
      set_element(X, i, ZERO);
      break;

    case 5:
      /* c = 1, test for >= 0*/
      set_element(C, i, ONE);
      set_element(X, i, ONE);
      break;

    case 6:
      /* c = 2, test for > 0 */
      set_element(C, i, TWO);
      set_element(X, i, TWO);
      break;
    }
  }

  start_time = get_time();
  test       = N_VConstrMask(C, X, M);
  sync_device(X);
  stop_time = get_time();

  /* M should be vector of 0 */
  failure = check_ans(ZERO, M, local_length);

  if (failure || !test)
  {
    printf(">>> FAILED test -- N_VConstrMask Case 1, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VConstrMask Case 1 \n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VConstrMask", maxt);

  /*
   * Case 2: Return False
   */

  /* reset failure */
  failure = 0;

  /* fill vector data */
  for (i = 0; i < local_length; i++)
  {
    set_element(M, i, NEG_ONE);

    switch (i % 5)
    {
    case 0:
      /* c = -2, test for < 0*/
      set_element(C, i, NEG_TWO);
      set_element(X, i, TWO);
      break;

    case 1:
      /* c = -1, test for <= 0 */
      set_element(C, i, NEG_ONE);
      set_element(X, i, ONE);
      break;

    case 2:
      /* c = 0, no test */
      set_element(C, i, ZERO);
      set_element(X, i, HALF);
      break;

    case 3:
      /* c = 1, test for >= 0*/
      set_element(C, i, ONE);
      set_element(X, i, NEG_ONE);
      break;

    case 4:
      /* c = 2, test for > 0 */
      set_element(C, i, TWO);
      set_element(X, i, NEG_TWO);
      break;
    }
  }

  start_time = get_time();
  test       = N_VConstrMask(C, X, M);
  sync_device(X);
  stop_time = get_time();

  /* check mask vector */
  for (i = 0; i < local_length; i++)
  {
    if ((i % 5) == 2)
    {
      if (get_element(M, i) != ZERO) { failure = 1; }
    }
    else
    {
      if (get_element(M, i) != ONE) { failure = 1; }
    }
  }

  if (failure || test)
  {
    printf(">>> FAILED test -- N_VConstrMask Case 2, Proc %d \n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VConstrMask Case 2 \n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VConstrMask", maxt);

  return (fails);
}